

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O2

optional<bool> __thiscall tinyusdz::crate::CrateValue::get_value<bool>(CrateValue *this)

{
  undefined8 in_RAX;
  bool in_SIL;
  undefined1 local_12;
  undefined1 local_11;
  
  _local_12 = (undefined2)((ulong)in_RAX >> 0x30);
  tinyusdz::value::Value::get_value<bool>((Value *)&stack0xffffffffffffffee,in_SIL);
  *(undefined1 *)&(this->value_).v_.storage = local_12;
  if (local_12 == '\x01') {
    *(undefined1 *)((long)&(this->value_).v_.storage + 1) = local_11;
  }
  return SUB82(this,0);
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }